

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O1

void __thiscall
ktxApp::ktxApp(ktxApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  initializer_list<argparser::option> __l;
  allocator_type local_c1;
  option local_c0;
  char *local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  char *local_80;
  undefined4 local_78;
  int *local_70;
  undefined4 local_68;
  char *local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  this->_vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_0011ca78;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->version = version;
  this->defaultVersion = defaultVersion;
  this->options = options;
  local_c0.name = "help";
  local_c0.has_arg = no_argument;
  local_c0.flag = (int *)0x0;
  local_c0.val = 0x68;
  local_a0 = "version";
  local_98 = 0;
  local_90 = 0;
  local_88 = 0x76;
  local_70 = &options->test;
  local_80 = "test";
  local_78 = 0;
  local_68 = 1;
  local_60 = "-NSDocumentRevisionsDebugMode";
  local_58 = 1;
  local_50 = 0;
  local_48 = 10000;
  local_40 = 0;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  __l._M_len = 5;
  __l._M_array = &local_c0;
  std::vector<argparser::option,_std::allocator<argparser::option>_>::vector
            (&this->option_list,__l,&local_c1);
  (this->short_opts)._M_dataplus._M_p = (pointer)&(this->short_opts).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->short_opts,"hv","");
  return;
}

Assistant:

ktxApp(std::string& version, std::string& defaultVersion,
           commandOptions& options)
        : version(version), defaultVersion(defaultVersion),
          options(options) { }